

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3CompleteInsertion
               (Parse *pParse,Table *pTab,int baseCur,int regRowid,int *aRegIdx,int isUpdate,
               int appendBias,int useSeekResult)

{
  int p3;
  Vdbe *p;
  byte bVar1;
  int regRec;
  int regData;
  u8 pik_flags;
  Index *pIdx;
  int nIdx;
  Vdbe *v;
  int i;
  int isUpdate_local;
  int *aRegIdx_local;
  int regRowid_local;
  int baseCur_local;
  Table *pTab_local;
  Parse *pParse_local;
  
  p = sqlite3GetVdbe(pParse);
  pIdx._4_4_ = 0;
  for (_regData = pTab->pIndex; _regData != (Index *)0x0; _regData = _regData->pNext) {
    pIdx._4_4_ = pIdx._4_4_ + 1;
  }
  while (v._0_4_ = pIdx._4_4_ + -1, -1 < (int)v) {
    pIdx._4_4_ = (int)v;
    if ((aRegIdx[(int)v] != 0) &&
       (sqlite3VdbeAddOp2(p,0x61,baseCur + (int)v + 1,aRegIdx[(int)v]), useSeekResult != 0)) {
      sqlite3VdbeChangeP5(p,'\x10');
    }
  }
  p3 = sqlite3GetTempReg(pParse);
  sqlite3VdbeAddOp3(p,0x1f,regRowid + 1,(int)pTab->nCol,p3);
  sqlite3TableAffinityStr(p,pTab);
  sqlite3ExprCacheAffinityChange(pParse,regRowid + 1,(int)pTab->nCol);
  if (pParse->nested == '\0') {
    bVar1 = 2;
    if (isUpdate != 0) {
      bVar1 = 4;
    }
    regRec._3_1_ = bVar1 | 1;
  }
  else {
    regRec._3_1_ = 0;
  }
  if (appendBias != 0) {
    regRec._3_1_ = regRec._3_1_ | 8;
  }
  if (useSeekResult != 0) {
    regRec._3_1_ = regRec._3_1_ | 0x10;
  }
  sqlite3VdbeAddOp3(p,0x39,baseCur,p3,regRowid);
  if (pParse->nested == '\0') {
    sqlite3VdbeChangeP4(p,-1,pTab->zName,0);
  }
  sqlite3VdbeChangeP5(p,regRec._3_1_);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3CompleteInsertion(
  Parse *pParse,      /* The parser context */
  Table *pTab,        /* the table into which we are inserting */
  int baseCur,        /* Index of a read/write cursor pointing at pTab */
  int regRowid,       /* Range of content */
  int *aRegIdx,       /* Register used by each index.  0 for unused indices */
  int isUpdate,       /* True for UPDATE, False for INSERT */
  int appendBias,     /* True if this is likely to be an append */
  int useSeekResult   /* True to set the USESEEKRESULT flag on OP_[Idx]Insert */
){
  int i;
  Vdbe *v;
  int nIdx;
  Index *pIdx;
  u8 pik_flags;
  int regData;
  int regRec;

  v = sqlite3GetVdbe(pParse);
  assert( v!=0 );
  assert( pTab->pSelect==0 );  /* This table is not a VIEW */
  for(nIdx=0, pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext, nIdx++){}
  for(i=nIdx-1; i>=0; i--){
    if( aRegIdx[i]==0 ) continue;
    sqlite3VdbeAddOp2(v, OP_IdxInsert, baseCur+i+1, aRegIdx[i]);
    if( useSeekResult ){
      sqlite3VdbeChangeP5(v, OPFLAG_USESEEKRESULT);
    }
  }
  regData = regRowid + 1;
  regRec = sqlite3GetTempReg(pParse);
  sqlite3VdbeAddOp3(v, OP_MakeRecord, regData, pTab->nCol, regRec);
  sqlite3TableAffinityStr(v, pTab);
  sqlite3ExprCacheAffinityChange(pParse, regData, pTab->nCol);
  if( pParse->nested ){
    pik_flags = 0;
  }else{
    pik_flags = OPFLAG_NCHANGE;
    pik_flags |= (isUpdate?OPFLAG_ISUPDATE:OPFLAG_LASTROWID);
  }
  if( appendBias ){
    pik_flags |= OPFLAG_APPEND;
  }
  if( useSeekResult ){
    pik_flags |= OPFLAG_USESEEKRESULT;
  }
  sqlite3VdbeAddOp3(v, OP_Insert, baseCur, regRec, regRowid);
  if( !pParse->nested ){
    sqlite3VdbeChangeP4(v, -1, pTab->zName, P4_TRANSIENT);
  }
  sqlite3VdbeChangeP5(v, pik_flags);
}